

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void PathBezierQuadraticCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float tess_tol,int level)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float y3_00;
  ImVec2 local_18;
  
  while( true ) {
    fVar1 = x3 - x1;
    fVar2 = y3 - y1;
    fVar3 = (x2 - x3) * fVar2 - (y2 - y3) * fVar1;
    if (fVar3 * fVar3 * 4.0 < (fVar1 * fVar1 + fVar2 * fVar2) * tess_tol) {
      local_18.x = x3;
      local_18.y = y3;
      ImVector<ImVec2>::push_back(path,&local_18);
      return;
    }
    if (9 < level) break;
    fVar1 = (x1 + x2) * 0.5;
    x2 = (x3 + x2) * 0.5;
    fVar2 = (y1 + y2) * 0.5;
    y2 = (y3 + y2) * 0.5;
    fVar3 = (x2 + fVar1) * 0.5;
    y3_00 = (y2 + fVar2) * 0.5;
    level = level + 1;
    PathBezierQuadraticCurveToCasteljau(path,x1,y1,fVar1,fVar2,fVar3,y3_00,tess_tol,level);
    x1 = fVar3;
    y1 = y3_00;
  }
  return;
}

Assistant:

static void PathBezierQuadraticCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float tess_tol, int level)
{
    float dx = x3 - x1, dy = y3 - y1;
    float det = (x2 - x3) * dy - (y2 - y3) * dx;
    if (det * det * 4.0f < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x3, y3));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        PathBezierQuadraticCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, tess_tol, level + 1);
        PathBezierQuadraticCurveToCasteljau(path, x123, y123, x23, y23, x3, y3, tess_tol, level + 1);
    }
}